

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

vector<float,_std::allocator<float>_> *
o4_roots<float>(vector<float,_std::allocator<float>_> *__return_storage_ptr__,
               Matrix<float,_5,_1,_0,_5,_1> *p)

{
  iterator iVar1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar4;
  double dVar5;
  undefined4 uVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined8 in_XMM7_Qb;
  double dVar11;
  complex<double> P;
  complex<double> Q;
  complex<double> R;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  double local_a0;
  undefined1 local_98 [16];
  double local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  double local_58 [2];
  undefined1 local_48 [16];
  double local_38;
  double local_30 [2];
  undefined1 local_20 [16];
  
  local_78._8_8_ = local_78._0_8_;
  local_b8._8_8_ = local_b8._0_8_;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dVar11 = (double)*(float *)p;
  local_a0 = (double)*(float *)(p + 4);
  dVar10 = (double)*(float *)(p + 8);
  dVar9 = dVar11 * dVar11;
  dVar5 = local_a0 * local_a0;
  dVar8 = dVar9 * dVar11;
  local_68._0_8_ = dVar10 / dVar11 - (dVar5 * 3.0) / (dVar9 * 8.0);
  local_80 = (double)*(float *)(p + 0xc) / dVar11 +
             ((dVar5 * local_a0) / (dVar8 * 8.0) - (local_a0 * dVar10) / (dVar9 + dVar9));
  local_48._8_8_ = local_48._0_8_;
  local_48._0_8_ = dVar11;
  uVar3 = (undefined4)in_XMM7_Qb;
  uVar7 = (uint)((ulong)in_XMM7_Qb >> 0x20);
  dVar5 = (double)*(float *)(p + 0x10) / dVar11 +
          (local_a0 * (double)*(float *)(p + 0xc)) / (dVar9 * -4.0) +
          (dVar5 * dVar10) / (dVar8 * 16.0) +
          (dVar5 * local_a0 * local_a0 * 3.0) / (dVar8 * dVar11 * -256.0);
  dVar9 = ((double)local_68._0_8_ * (double)local_68._0_8_) / -12.0 - dVar5;
  local_58[1] = 0.0;
  local_68._8_8_ = in_XMM7_Qb;
  local_30[0] = local_80 * local_80 * -0.125 +
                (dVar5 * (double)local_68._0_8_) / 3.0 +
                ((double)local_68._0_8_ * (double)local_68._0_8_ * (double)local_68._0_8_) / -108.0;
  local_30[1] = 0.0;
  local_c0 = 2.0;
  local_58[0] = dVar9;
  local_98._0_8_ = local_30[0];
  std::pow<double>((complex<double> *)local_30,(double *)&local_c0);
  local_b8._0_8_ = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  local_78._0_8_ = dVar9;
  local_38 = 3.0;
  std::pow<double>((complex<double> *)local_58,&local_38);
  local_98._0_8_ = (double)local_98._0_8_ * 0.5;
  dVar5 = dVar9 / 27.0 + (double)local_78._0_8_ * 0.25;
  local_20._0_8_ =
       csqrt((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) / 27.0 +
             (double)local_b8._0_8_ * 0.25);
  local_20._0_8_ = (double)local_20._0_8_ - (double)local_98._0_8_;
  local_c0._0_4_ = 1.4660155e+13;
  local_c0._4_4_ = 0x3fd55555;
  local_20._8_8_ = dVar5;
  std::pow<double>((complex<double> *)local_20,(double *)&local_c0);
  if (((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01) != 0.0) ||
     (NAN((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01)))) {
    local_b8._0_8_ = ((double)local_68._0_8_ * -5.0) / 6.0;
    local_98._0_8_ = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
    local_78._8_4_ = uVar3;
    local_78._0_8_ = dVar5;
    local_78._12_4_ = uVar7;
    uVar4 = SUB84(local_58[1],0);
    uVar6 = (undefined4)((ulong)local_58[1] >> 0x20);
    dVar5 = (double)__divdc3(SUB84(local_58[0],0),uVar4,
                             SUB84((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01) * 3.0,0
                                  ),dVar5 * 3.0);
    dVar9 = ((double)local_b8._0_8_ - dVar5) + (double)local_98._0_8_;
    uVar3 = local_78._8_4_;
    uVar7 = local_78._12_4_;
    dVar5 = local_78._0_8_ - (double)CONCAT44(uVar6,uVar4);
  }
  else {
    local_c0._0_4_ = 1.4660155e+13;
    local_c0._4_4_ = 0x3fd55555;
    std::pow<double>((complex<double> *)local_30,(double *)&local_c0);
    dVar5 = -dVar5;
    uVar7 = uVar7 ^ 0x80000000;
    dVar9 = (local_68._0_8_ * -5.0) / 6.0 -
            (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
  }
  local_b8._0_8_ = dVar9 + dVar9;
  dVar5 = dVar5 + dVar5;
  local_78._8_4_ = uVar3;
  local_78._0_8_ = dVar5;
  local_78._12_4_ = uVar7;
  dVar9 = csqrt((double)CONCAT44(local_68._4_4_,local_68._0_4_) + dVar9 + dVar9);
  local_98._8_4_ = uVar3;
  local_98._0_8_ = dVar5;
  local_98._12_4_ = uVar7;
  local_a0 = local_a0 / ((double)local_48._0_8_ * -4.0);
  uVar3 = local_68._12_4_;
  local_68._8_4_ = local_68._8_4_;
  local_68._0_8_ = local_68._0_8_ * 3.0 + (double)local_b8._0_8_;
  local_68._12_4_ = uVar3;
  local_80 = local_80 + local_80;
  uVar3 = 0;
  uVar4 = 0;
  local_b8._8_4_ = extraout_XMM0_Dc;
  local_b8._0_8_ = dVar9;
  local_b8._12_4_ = extraout_XMM0_Dd;
  dVar5 = (double)__divdc3();
  dVar9 = (double)CONCAT44(uVar4,uVar3) + (double)local_78._0_8_;
  uVar7 = (uint)((ulong)dVar9 >> 0x20) ^ 0x80000000;
  uVar3 = SUB84(dVar9,0);
  dVar5 = csqrt(-(dVar5 + (double)local_68._0_8_));
  if (ABS(((double)CONCAT44(uVar7,uVar3) + (double)local_98._0_8_) * 0.5) < 1e-06) {
    local_c0._0_4_ = (float)((dVar5 + (double)local_b8._0_8_) * 0.5 + local_a0);
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (__return_storage_ptr__,(iterator)0x0,(float *)&local_c0);
  }
  uVar3 = 0;
  uVar4 = 0;
  dVar5 = (double)__divdc3(SUB84(local_80,0),0,local_b8._0_4_,local_98._0_8_);
  dVar9 = (double)CONCAT44(uVar4,uVar3) + (double)local_78._0_8_;
  uVar7 = (uint)((ulong)dVar9 >> 0x20) ^ 0x80000000;
  uVar3 = SUB84(dVar9,0);
  dVar5 = csqrt(-(dVar5 + (double)local_68._0_8_));
  if (ABS(((double)local_98._0_8_ - (double)CONCAT44(uVar7,uVar3)) * 0.5) < 1e-06) {
    local_c0._0_4_ = (float)(((double)local_b8._0_8_ - dVar5) * 0.5 + local_a0);
    iVar1._M_current =
         (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (__return_storage_ptr__,iVar1,(float *)&local_c0);
    }
    else {
      *iVar1._M_current = (float)local_c0;
      (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  uVar3 = 0;
  uVar4 = 0;
  dVar5 = (double)__divdc3(SUB84(local_80,0),0,local_b8._0_4_,local_98._0_8_);
  dVar9 = (double)local_78._0_8_ - (double)CONCAT44(uVar4,uVar3);
  uVar7 = (uint)((ulong)dVar9 >> 0x20) ^ 0x80000000;
  uVar3 = SUB84(dVar9,0);
  dVar5 = csqrt(-((double)local_68._0_8_ - dVar5));
  if (ABS(((double)CONCAT44(uVar7,uVar3) - (double)local_98._0_8_) * 0.5) < 1e-06) {
    local_c0._0_4_ = (float)((dVar5 - (double)local_b8._0_8_) * 0.5 + local_a0);
    iVar1._M_current =
         (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (__return_storage_ptr__,iVar1,(float *)&local_c0);
    }
    else {
      *iVar1._M_current = (float)local_c0;
      (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  local_48._8_4_ = local_98._8_4_;
  local_48._0_8_ = local_98._0_8_ ^ 0x8000000000000000;
  local_48._12_4_ = local_98._12_4_ ^ 0x80000000;
  uVar3 = 0;
  uVar4 = 0;
  dVar5 = (double)__divdc3(SUB84(local_80,0),0,local_b8._0_4_);
  dVar9 = (double)local_78._0_8_ - (double)CONCAT44(uVar4,uVar3);
  uVar7 = (uint)((ulong)dVar9 >> 0x20) ^ 0x80000000;
  uVar3 = SUB84(dVar9,0);
  dVar5 = csqrt(-((double)local_68._0_8_ - dVar5));
  if (ABS(((double)local_48._0_8_ - (double)CONCAT44(uVar7,uVar3)) * 0.5) < 1e-06) {
    fVar2 = (float)(local_a0 + (-(double)local_b8._0_8_ - dVar5) * 0.5);
    local_c0 = (double)CONCAT44(local_c0._4_4_,fVar2);
    iVar1._M_current =
         (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (__return_storage_ptr__,iVar1,(float *)&local_c0);
    }
    else {
      *iVar1._M_current = fVar2;
      (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<floatPrec> o4_roots(const Matrix<floatPrec, 5, 1> &p)
{

  vector<floatPrec> realRoots;
  complex<double> temp;

  double A = (double)p(0, 0);
  double B = (double)p(1, 0);
  double C = (double)p(2, 0);
  double D = (double)p(3, 0);
  double E = (double)p(4, 0);

  double A_pw2 = A * A;
  double B_pw2 = B * B;
  double A_pw3 = A_pw2 * A;
  double B_pw3 = B_pw2 * B;
  double A_pw4 = A_pw3 * A;
  double B_pw4 = B_pw3 * B;

  double alpha = -3 * B_pw2 / (8 * A_pw2) + C / A;
  double beta = B_pw3 / (8 * A_pw3) - B * C / (2 * A_pw2) + D / A;
  double gamma = -3 * B_pw4 / (256 * A_pw4) + B_pw2 * C / (16 * A_pw3) - B * D / (4 * A_pw2) + E / A;

  double alpha_pw2 = alpha * alpha;
  double alpha_pw3 = alpha_pw2 * alpha;

  complex<double> P(-alpha_pw2 / 12.0 - gamma, 0);
  complex<double> Q(-alpha_pw3 / 108.0 + alpha * gamma / 3 - pow(beta, 2) / 8, 0);
  complex<double> R = -Q / 2.0 + sqrt(pow(Q, 2.0) / 4.0 + pow(P, 3.0) / 27.0);

  complex<double> U = pow(R, (1.0 / 3.0));
  complex<double> y;

  if (U.real() == 0)
    y = -5.0 * alpha / 6.0 - pow(Q, (1.0 / 3.0));
  else
    y = -5.0 * alpha / 6.0 - P / (3.0 * U) + U;

  complex<double> w = sqrt(alpha + 2.0 * y);

  temp = (floatPrec)-B / (4.0 * A) + 0.5 * (w + sqrt(-(3.0 * alpha + 2.0 * y + 2.0 * beta / w)));
  if (abs(temp.imag()) < 0.000001)
    realRoots.push_back((float)temp.real());

  temp = (floatPrec)-B / (4.0 * A) + 0.5 * (w - sqrt(-(3.0 * alpha + 2.0 * y + 2.0 * beta / w)));
  if (abs(temp.imag()) < 0.000001)
    realRoots.push_back((float)temp.real());

  temp = (floatPrec)-B / (4.0 * A) + 0.5 * (-w + sqrt(-(3.0 * alpha + 2.0 * y - 2.0 * beta / w)));
  if (abs(temp.imag()) < 0.000001)
    realRoots.push_back((float)temp.real());

  temp = (floatPrec)-B / (4.0 * A) + 0.5 * (-w - sqrt(-(3.0 * alpha + 2.0 * y - 2.0 * beta / w)));
  if (abs(temp.imag()) < 0.000001)
    realRoots.push_back((float)temp.real());

  return realRoots;
}